

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O0

Vec3 __thiscall
deqp::gles3::Functional::MatrixCaseUtils::reduceToVec3(MatrixCaseUtils *this,Mat4 *value)

{
  Vector<float,_4> *pVVar1;
  Vector<float,_3> VVar2;
  Vec3 VVar3;
  undefined1 local_60 [12];
  undefined1 local_54 [12];
  undefined1 local_48 [12];
  undefined1 local_3c [12];
  Vector<float,_3> local_30;
  Vector<float,_3> local_24;
  Mat4 *local_18;
  Mat4 *value_local;
  float fVar4;
  
  local_18 = value;
  value_local = (Mat4 *)this;
  pVVar1 = tcu::Matrix<float,_4,_4>::getColumn(value,0);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_3c,(int)pVVar1,0,1);
  pVVar1 = tcu::Matrix<float,_4,_4>::getColumn(local_18,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_48,(int)pVVar1,1,2);
  tcu::operator+((tcu *)&local_30,(Vector<float,_3> *)local_3c,(Vector<float,_3> *)local_48);
  pVVar1 = tcu::Matrix<float,_4,_4>::getColumn(local_18,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_54,(int)pVVar1,2,3);
  tcu::operator+((tcu *)&local_24,&local_30,(Vector<float,_3> *)local_54);
  pVVar1 = tcu::Matrix<float,_4,_4>::getColumn(local_18,3);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_60,(int)pVVar1,3,0);
  VVar2 = tcu::operator+((tcu *)this,&local_24,(Vector<float,_3> *)local_60);
  VVar3.m_data[0] = VVar2.m_data[0];
  VVar3.m_data[1] = VVar2.m_data[1];
  register0x00001240 = VVar2.m_data[2];
  return (Vec3)VVar3.m_data;
}

Assistant:

inline tcu::Vec3 reduceToVec3 (const tcu::Mat4& value)		{ return value.getColumn(0).swizzle(0,1,2) + value.getColumn(1).swizzle(1,2,3) + value.getColumn(2).swizzle(2,3,0) + value.getColumn(3).swizzle(3,0,1); }